

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enter.hpp
# Opt level: O3

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::computeCoTest(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *this)

{
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *this_00;
  cpp_dec_float<50U,_int,_void> *this_01;
  uint *puVar1;
  Status stat;
  undefined8 uVar2;
  pointer pnVar3;
  SPxOut *pSVar4;
  ostream *poVar5;
  char cVar6;
  uint uVar7;
  int iVar8;
  long_long_type lVar9;
  fpclass_type fVar10;
  long lVar11;
  char *pcVar12;
  int iVar13;
  long lVar14;
  ulong uVar15;
  cpp_dec_float<50U,_int,_void> vv;
  Verbosity old_verbosity_1;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  pricingTol;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  int local_130;
  cpp_dec_float<50U,_int,_void> local_128;
  Verbosity local_ec;
  DIdxSet *local_e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_e0;
  cpp_dec_float<50U,_int,_void> local_a8;
  cpp_dec_float<50U,_int,_void> local_68;
  
  leavetol(&local_e0,this);
  this->m_pricingViolUpToDate = true;
  this_00 = &this->m_pricingViol;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=(&this_00->m_backend,0);
  this->m_numViol = 0;
  (this->infeasibilities).super_IdxSet.num = 0;
  local_a8.fpclass = cpp_dec_float_finite;
  local_a8.prec_elem = 10;
  local_a8.data._M_elems[0] = 0;
  local_a8.data._M_elems[1] = 0;
  local_a8.data._M_elems[2] = 0;
  local_a8.data._M_elems[3] = 0;
  local_a8.data._M_elems[4] = 0;
  local_a8.data._M_elems[5] = 0;
  local_a8.data._M_elems._24_5_ = 0;
  local_a8.data._M_elems[7]._1_3_ = 0;
  local_a8.data._M_elems._32_5_ = 0;
  local_a8.data._M_elems[9]._1_3_ = 0;
  local_a8.exp = 0;
  local_a8.neg = false;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
            (&local_128,(long)(this->thecovectors->set).thenum,(type *)0x0);
  if (&local_a8 != &(this->sparsePricingFactor).m_backend) {
    uVar2 = *(undefined8 *)((this->sparsePricingFactor).m_backend.data._M_elems + 8);
    local_a8.data._M_elems._32_5_ = SUB85(uVar2,0);
    local_a8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar2 >> 0x28);
    local_a8.data._M_elems._0_8_ =
         *(undefined8 *)(this->sparsePricingFactor).m_backend.data._M_elems;
    local_a8.data._M_elems._8_8_ =
         *(undefined8 *)((this->sparsePricingFactor).m_backend.data._M_elems + 2);
    local_a8.data._M_elems._16_8_ =
         *(undefined8 *)((this->sparsePricingFactor).m_backend.data._M_elems + 4);
    uVar2 = *(undefined8 *)((this->sparsePricingFactor).m_backend.data._M_elems + 6);
    local_a8.data._M_elems._24_5_ = SUB85(uVar2,0);
    local_a8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar2 >> 0x28);
    local_a8.exp = (this->sparsePricingFactor).m_backend.exp;
    local_a8.neg = (this->sparsePricingFactor).m_backend.neg;
    local_a8.fpclass = (this->sparsePricingFactor).m_backend.fpclass;
    local_a8.prec_elem = (this->sparsePricingFactor).m_backend.prec_elem;
  }
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=(&local_a8,&local_128);
  lVar9 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::extract_signed_long_long
                    (&local_a8);
  lVar11 = -0x80000000;
  if (-0x80000000 < lVar9) {
    lVar11 = lVar9;
  }
  if (0x7ffffffe < lVar11) {
    lVar11 = 0x7fffffff;
  }
  lVar14 = (long)(this->thecovectors->set).thenum;
  if (0 < lVar14) {
    local_e8 = &this->infeasibilities;
    uVar15 = lVar14 + 1;
    lVar14 = lVar14 * 0x38;
    do {
      stat = ((this->
              super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).thedesc.costat)->data[uVar15 - 2];
      if (this->theRep * stat < 1) {
        iVar13 = (int)uVar15 + -2;
        coTest((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)&local_128,this,iVar13,stat);
        pnVar3 = (this->theCoTest).val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        *(undefined8 *)((long)pnVar3[-1].m_backend.data._M_elems + lVar14 + 0x20) =
             local_128.data._M_elems._32_8_;
        puVar1 = (uint *)((long)pnVar3[-1].m_backend.data._M_elems + lVar14 + 0x10);
        *(undefined8 *)puVar1 = local_128.data._M_elems._16_8_;
        *(undefined8 *)(puVar1 + 2) = local_128.data._M_elems._24_8_;
        puVar1 = (uint *)((long)pnVar3[-1].m_backend.data._M_elems + lVar14);
        *(undefined8 *)puVar1 = local_128.data._M_elems._0_8_;
        *(undefined8 *)(puVar1 + 2) = local_128.data._M_elems._8_8_;
        *(int *)((long)(&pnVar3[-1].m_backend.data + 1) + lVar14) = local_128.exp;
        *(bool *)((long)(&pnVar3[-1].m_backend.data + 1) + lVar14 + 4U) = local_128.neg;
        *(undefined8 *)((long)(&pnVar3[-1].m_backend.data + 1) + lVar14 + 8U) = local_128._48_8_;
        pnVar3 = (this->theCoTest).val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        this_01 = (cpp_dec_float<50U,_int,_void> *)
                  ((long)pnVar3[-1].m_backend.data._M_elems + lVar14);
        local_128.data._M_elems[0] = local_e0.m_backend.data._M_elems[0];
        uVar7 = local_128.data._M_elems[0];
        fVar10 = local_e0.m_backend.fpclass;
        if (this->remainingRoundsEnter == 0) {
          local_128.data._M_elems[0] = local_e0.m_backend.data._M_elems[0];
          local_128.data._M_elems[1] = local_e0.m_backend.data._M_elems[1];
          local_128.data._M_elems[2] = local_e0.m_backend.data._M_elems[2];
          local_128.data._M_elems[3] = local_e0.m_backend.data._M_elems[3];
          local_128.data._M_elems[8] = local_e0.m_backend.data._M_elems[8];
          local_128.data._M_elems[9] = local_e0.m_backend.data._M_elems[9];
          local_128.data._M_elems[4] = local_e0.m_backend.data._M_elems[4];
          local_128.data._M_elems[5] = local_e0.m_backend.data._M_elems[5];
          local_128.data._M_elems[6] = local_e0.m_backend.data._M_elems[6];
          local_128.data._M_elems[7] = local_e0.m_backend.data._M_elems[7];
          local_128.exp = local_e0.m_backend.exp;
          local_128.neg = local_e0.m_backend.neg;
          local_128.fpclass = local_e0.m_backend.fpclass;
          local_128.prec_elem = local_e0.m_backend.prec_elem;
          if (uVar7 != 0 || fVar10 != cpp_dec_float_finite) {
            local_128.neg = (bool)(local_e0.m_backend.neg ^ 1);
          }
          if (((fVar10 == cpp_dec_float_NaN) ||
              (*(int *)((long)(&pnVar3[-1].m_backend.data + 1) + lVar14 + 8U) == 2)) ||
             (iVar8 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                (this_01,&local_128), -1 < iVar8)) {
            (this->isInfeasible).data[uVar15 - 2] = 0;
          }
          else {
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                      (&this_00->m_backend,
                       (cpp_dec_float<50U,_int,_void> *)
                       ((long)(this->theCoTest).val.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data._M_elems
                       + lVar14));
            DIdxSet::addIdx(local_e8,iVar13);
            (this->isInfeasible).data[uVar15 - 2] = 1;
            this->m_numViol = this->m_numViol + 1;
          }
          if ((int)lVar11 < (this->infeasibilities).super_IdxSet.num) {
            pSVar4 = this->spxout;
            if ((pSVar4 != (SPxOut *)0x0) && (3 < (int)pSVar4->m_verbosity)) {
              local_128.data._M_elems[0] = pSVar4->m_verbosity;
              local_a8.data._M_elems[0] = 4;
              (*pSVar4->_vptr_SPxOut[2])(pSVar4,&local_a8);
              pSVar4 = this->spxout;
              std::__ostream_insert<char,std::char_traits<char>>
                        (pSVar4->m_streams[pSVar4->m_verbosity]," --- using dense pricing",0x18);
              cVar6 = (char)pSVar4->m_streams[pSVar4->m_verbosity];
              std::ios::widen((char)*(undefined8 *)
                                     (*(long *)pSVar4->m_streams[pSVar4->m_verbosity] + -0x18) +
                              cVar6);
              std::ostream::put(cVar6);
              std::ostream::flush();
              (*this->spxout->_vptr_SPxOut[2])();
            }
            this->remainingRoundsEnter = 5;
            this->sparsePricingEnter = false;
            (this->infeasibilities).super_IdxSet.num = 0;
          }
        }
        else {
          local_128.data._M_elems[0] = local_e0.m_backend.data._M_elems[0];
          local_128.data._M_elems[1] = local_e0.m_backend.data._M_elems[1];
          local_128.data._M_elems[2] = local_e0.m_backend.data._M_elems[2];
          local_128.data._M_elems[3] = local_e0.m_backend.data._M_elems[3];
          local_128.data._M_elems[8] = local_e0.m_backend.data._M_elems[8];
          local_128.data._M_elems[9] = local_e0.m_backend.data._M_elems[9];
          local_128.data._M_elems[4] = local_e0.m_backend.data._M_elems[4];
          local_128.data._M_elems[5] = local_e0.m_backend.data._M_elems[5];
          local_128.data._M_elems[6] = local_e0.m_backend.data._M_elems[6];
          local_128.data._M_elems[7] = local_e0.m_backend.data._M_elems[7];
          local_128.exp = local_e0.m_backend.exp;
          local_128.neg = local_e0.m_backend.neg;
          local_128.fpclass = local_e0.m_backend.fpclass;
          local_128.prec_elem = local_e0.m_backend.prec_elem;
          if (uVar7 != 0 || fVar10 != cpp_dec_float_finite) {
            local_128.neg = (bool)(local_e0.m_backend.neg ^ 1);
          }
          if (((fVar10 != cpp_dec_float_NaN) &&
              (*(int *)((long)(&pnVar3[-1].m_backend.data + 1) + lVar14 + 8U) != 2)) &&
             (iVar13 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                 (this_01,&local_128), iVar13 < 0)) {
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                      (&this_00->m_backend,
                       (cpp_dec_float<50U,_int,_void> *)
                       ((long)(this->theCoTest).val.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data._M_elems
                       + lVar14));
            this->m_numViol = this->m_numViol + 1;
          }
        }
      }
      else {
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                  ((cpp_dec_float<50U,_int,_void> *)
                   ((long)(this->theCoTest).val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data._M_elems +
                   lVar14),0);
        if (this->remainingRoundsEnter == 0) {
          (this->isInfeasible).data[uVar15 - 2] = 0;
        }
      }
      uVar15 = uVar15 - 1;
      lVar14 = lVar14 + -0x38;
    } while (1 < uVar15);
  }
  iVar13 = (this->infeasibilities).super_IdxSet.num;
  if ((iVar13 == 0) && (this->sparsePricingEnter == false)) {
    this->remainingRoundsEnter = this->remainingRoundsEnter + -1;
  }
  else if ((iVar13 <= (int)lVar11) && (this->sparsePricingEnter == false)) {
    pSVar4 = this->spxout;
    if ((pSVar4 != (SPxOut *)0x0) && (local_ec = pSVar4->m_verbosity, 3 < (int)local_ec)) {
      local_128.data._M_elems[0] = 4;
      (*pSVar4->_vptr_SPxOut[2])();
      poVar5 = this->spxout->m_streams[this->spxout->m_verbosity];
      uVar2 = *(undefined8 *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 8);
      if (this->hyperPricingEnter == true) {
        pcVar12 = " --- using hypersparse pricing, ";
        lVar11 = 0x20;
      }
      else {
        pcVar12 = " --- using sparse pricing, ";
        lVar11 = 0x1b;
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar12,lVar11);
      pSVar4 = this->spxout;
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar4->m_streams[pSVar4->m_verbosity],"sparsity: ",10);
      poVar5 = pSVar4->m_streams[pSVar4->m_verbosity];
      lVar11 = *(long *)poVar5;
      *(undefined8 *)(poVar5 + *(long *)(lVar11 + -0x18) + 0x10) = 6;
      *(uint *)(poVar5 + *(long *)(lVar11 + -0x18) + 0x18) =
           *(uint *)(poVar5 + *(long *)(lVar11 + -0x18) + 0x18) & 0xfffffefb | 4;
      *(undefined8 *)(poVar5 + *(long *)(lVar11 + -0x18) + 8) = 4;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                (&local_a8,(long)(this->infeasibilities).super_IdxSet.num,(type *)0x0);
      local_68.fpclass = cpp_dec_float_finite;
      local_68.prec_elem = 10;
      local_68.data._M_elems[0] = 0;
      local_68.data._M_elems[1] = 0;
      local_68.data._M_elems[2] = 0;
      local_68.data._M_elems[3] = 0;
      local_68.data._M_elems[4] = 0;
      local_68.data._M_elems[5] = 0;
      local_68.data._M_elems._24_5_ = 0;
      local_68.data._M_elems[7]._1_3_ = 0;
      local_68.data._M_elems._32_5_ = 0;
      local_68._37_8_ = 0;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                (&local_128,(long)(this->thecovectors->set).thenum,(type *)0x0);
      boost::multiprecision::default_ops::
      eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (&local_68,&local_a8,&local_128);
      boost::multiprecision::operator<<
                (pSVar4->m_streams[pSVar4->m_verbosity],
                 (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)&local_68);
      poVar5 = pSVar4->m_streams[pSVar4->m_verbosity];
      lVar11 = *(long *)poVar5;
      *(uint *)(poVar5 + *(long *)(lVar11 + -0x18) + 0x18) =
           *(uint *)(poVar5 + *(long *)(lVar11 + -0x18) + 0x18) & 0xfffffefb | 0x100;
      local_130 = (int)uVar2;
      *(long *)(poVar5 + *(long *)(lVar11 + -0x18) + 8) = (long)local_130;
      std::ios::widen((char)*(undefined8 *)(lVar11 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
      (*this->spxout->_vptr_SPxOut[2])(this->spxout,&local_ec);
    }
    this->sparsePricingEnter = true;
  }
  return;
}

Assistant:

void SPxSolverBase<R>::computeCoTest()
{
   int i;
   R pricingTol = leavetol();
   m_pricingViolUpToDate = true;
   m_pricingViol = 0;
   m_numViol = 0;
   infeasibilities.clear();
   int sparsitythreshold = (int)(sparsePricingFactor * dim());
   const typename SPxBasisBase<R>::Desc& ds = this->desc();

   for(i = dim() - 1; i >= 0; --i)
   {
      typename SPxBasisBase<R>::Desc::Status stat = ds.coStatus(i);

      if(isBasic(stat))
      {
         theCoTest[i] = 0;

         if(remainingRoundsEnter == 0)
            isInfeasible[i] = SPxPricer<R>::NOT_VIOLATED;
      }
      else
      {
         theCoTest[i] = coTest(i, stat);

         if(remainingRoundsEnter == 0)
         {
            if(theCoTest[i] < -pricingTol)
            {
               assert(infeasibilities.size() < infeasibilities.max());
               m_pricingViol -= theCoTest[i];
               infeasibilities.addIdx(i);
               isInfeasible[i] = SPxPricer<R>::VIOLATED;
               ++m_numViol;
            }
            else
               isInfeasible[i] = SPxPricer<R>::NOT_VIOLATED;

            if(infeasibilities.size() > sparsitythreshold)
            {
               SPX_MSG_INFO2((*this->spxout), (*this->spxout) << " --- using dense pricing"
                             << std::endl;)
               remainingRoundsEnter = SOPLEX_DENSEROUNDS;
               sparsePricingEnter = false;
               infeasibilities.clear();
            }
         }
         else if(theCoTest[i] < -pricingTol)
         {
            m_pricingViol -= theCoTest[i];
            ++m_numViol;
         }
      }
   }

   if(infeasibilities.size() == 0 && !sparsePricingEnter)
      --remainingRoundsEnter;
   else if(infeasibilities.size() <= sparsitythreshold && !sparsePricingEnter)
   {
      SPX_MSG_INFO2((*this->spxout),
                    std::streamsize prec = spxout->precision();

                    if(hyperPricingEnter)
                    (*this->spxout) << " --- using hypersparse pricing, ";
                    else
                       (*this->spxout) << " --- using sparse pricing, ";
                       (*this->spxout) << "sparsity: "
                       << std::setw(6) << std::fixed << std::setprecision(4)
                       << (R) infeasibilities.size() / dim()
                       << std::scientific << std::setprecision(int(prec))
                       << std::endl;)
            sparsePricingEnter = true;
   }
}